

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBackCompatBlosc.cpp
# Opt level: O2

void __thiscall
adios2::format::BPBackCompatBlosc::GetMetadata
          (BPBackCompatBlosc *this,vector<char,_std::allocator<char>_> *buffer,Params *info)

{
  mapped_type *pmVar1;
  allocator local_59;
  key_type local_58;
  string local_38;
  
  std::__cxx11::to_string
            (&local_38,
             *(unsigned_long *)
              (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&local_58,"InputSize",&local_59);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](info,&local_58);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::to_string
            (&local_38,
             *(unsigned_long *)
              ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start + 8));
  std::__cxx11::string::string((string *)&local_58,"OutputSize",&local_59);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](info,&local_58);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void BPBackCompatBlosc::GetMetadata(const std::vector<char> &buffer, Params &info) const noexcept
{
    size_t position = 0;
    info["InputSize"] = std::to_string(helper::ReadValue<uint64_t>(buffer, position));
    info["OutputSize"] = std::to_string(helper::ReadValue<uint64_t>(buffer, position));
}